

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

void ga_get_(Integer *g_a,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,void *buf,Integer *ld)

{
  Integer hi [2];
  Integer lo [2];
  Integer *in_stack_00000160;
  void *in_stack_00000168;
  Integer *in_stack_00000170;
  Integer *in_stack_00000178;
  Integer in_stack_00000180;
  
  pnga_get(in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168,in_stack_00000160
          );
  return;
}

Assistant:

void FATR ga_get_(Integer *g_a, Integer *ilo, Integer *ihi, Integer *jlo,
                  Integer *jhi, void *buf, Integer *ld)
{
  Integer lo[2], hi[2];
  lo[0] = *ilo;
  lo[1] = *jlo;
  hi[0] = *ihi;
  hi[1] = *jhi;
  wnga_get(*g_a, lo, hi, buf, ld);
}